

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSObjectFactory::processFacets
          (XSObjectFactory *this,DatatypeValidator *dv,XSModel *xsModel,XSSimpleTypeDefinition *xsST
          )

{
  FACET FVar1;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_01;
  undefined4 extraout_var;
  XSMultiValueFacet *pXVar5;
  XSAnnotation *pXVar6;
  KVStringPair *key;
  XSFacet *pXVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar9;
  FACET facetKind;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *pBVar10;
  XSObjectFactory *this_02;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_03;
  FACET fixedFacets;
  FACET definedFacets;
  FACET local_fc;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *local_e8;
  BaseRefVectorOf<char16_t> *local_e0;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLStringTokenizer tokenizer;
  
  uVar4 = dv->fFacetsDefined;
  FVar1 = dv->fFixed;
  this_01 = (BaseRefVectorOf<xercesc_4_0::XSFacet> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  pBVar10 = this_01;
  RefVectorOf<xercesc_4_0::XSFacet>::RefVectorOf
            ((RefVectorOf<xercesc_4_0::XSFacet> *)this_01,4,false,this->fMemoryManager);
  bVar2 = isMultiValueFacetDefined((XSObjectFactory *)pBVar10,dv);
  fixedFacets = FACET_NONE;
  if (bVar2) {
    local_e8 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::XSMultiValueFacet>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::XSMultiValueFacet> *)local_e8,2,false,this->fMemoryManager)
    ;
  }
  else {
    local_e8 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0;
  }
  definedFacets = FACET_NONE;
  local_fc = FACET_NONE;
  if ((uVar4 & 0x10) != 0) {
    iVar3 = (*(dv->super_XSerializable)._vptr_XSerializable[6])();
    this_02 = (XSObjectFactory *)0x40;
    pXVar5 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar6 = getAnnotationFromModel(this_02,xsModel,(StringList *)CONCAT44(extraout_var,iVar3));
    local_fc = (FVar1 & FACET_WHITESPACE) >> 4;
    XSMultiValueFacet::XSMultiValueFacet
              (pXVar5,FACET_ENUMERATION,(StringList *)CONCAT44(extraout_var,iVar3),SUB41(local_fc,0)
               ,pXVar6,xsModel,this->fMemoryManager);
    fixedFacets = (FVar1 & FACET_WHITESPACE) << 7;
    BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
              (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)pXVar5
              );
    BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement(local_e8,pXVar5);
    definedFacets = FACET_ENUMERATION;
  }
  if (dv->fFacets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    local_e0 = (BaseRefVectorOf<char16_t> *)0x0;
  }
  else {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&e,dv->fFacets,false,this->fMemoryManager);
    bVar9 = (byte)FVar1;
    local_e0 = (BaseRefVectorOf<char16_t> *)0x0;
    while ((e.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (e.fCurHash != (e.fToEnum)->fHashModulus))) {
      this_03 = &e;
      key = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
            nextElement(this_03);
      pXVar8 = key->fKey;
      pXVar6 = getAnnotationFromModel((XSObjectFactory *)this_03,xsModel,key);
      bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE);
      if (bVar2) {
        facetKind = FACET_MAXINCLUSIVE;
        local_fc = (FACET)(bVar9 >> 5);
LAB_002c8115:
        pXVar7 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
        XSFacet::XSFacet(pXVar7,facetKind,key->fValue,(bool)((undefined1)local_fc & 1),pXVar6,
                         xsModel,this->fMemoryManager);
        BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
                  (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,
                   (XSObject *)pXVar7);
        BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_01,pXVar7);
        definedFacets = definedFacets | facetKind;
        if ((local_fc & FACET_LENGTH) == FACET_NONE) {
          facetKind = FACET_NONE;
        }
        fixedFacets = fixedFacets | facetKind;
      }
      else {
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MAXEXCLUSIVE);
        if (bVar2) {
          facetKind = FACET_MAXEXCLUSIVE;
          local_fc = (FACET)(bVar9 >> 6);
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE);
        if (bVar2) {
          facetKind = FACET_MININCLUSIVE;
          local_fc = (FACET)(bVar9 >> 7);
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MINEXCLUSIVE);
        if (bVar2) {
          facetKind = FACET_MINEXCLUSIVE;
          local_fc = FVar1 >> 8;
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_LENGTH);
        if (bVar2) {
          facetKind = FACET_LENGTH;
          local_fc = FVar1;
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MINLENGTH);
        if (bVar2) {
          facetKind = FACET_MINLENGTH;
          local_fc = (FACET)(bVar9 >> 1);
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_MAXLENGTH);
        if (bVar2) {
          facetKind = FACET_MAXLENGTH;
          local_fc = (FACET)(bVar9 >> 2);
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_TOTALDIGITS);
        if (bVar2) {
          facetKind = FACET_TOTALDIGITS;
          local_fc = FVar1 >> 9;
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS);
        if (bVar2) {
          facetKind = FACET_FRACTIONDIGITS;
          local_fc = FVar1 >> 10;
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE);
        if (bVar2) {
          facetKind = FACET_WHITESPACE;
          local_fc = FVar1 >> 0xe;
          goto LAB_002c8115;
        }
        bVar2 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
        if ((local_e8 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) && (bVar2)) {
          XMLStringTokenizer::XMLStringTokenizer
                    (&tokenizer,dv->fPattern,(XMLCh *)&regexSeparator,this->fMemoryManager);
          local_e0 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,this->fMemoryManager);
          uVar4 = XMLStringTokenizer::countTokens(&tokenizer);
          RefArrayVectorOf<char16_t>::RefArrayVectorOf
                    ((RefArrayVectorOf<char16_t> *)local_e0,(ulong)uVar4,true,this->fMemoryManager);
          while (bVar2 = XMLStringTokenizer::hasMoreTokens(&tokenizer), bVar2) {
            pXVar8 = XMLStringTokenizer::nextToken(&tokenizer);
            pXVar8 = XMLString::replicate(pXVar8,this->fMemoryManager);
            BaseRefVectorOf<char16_t>::addElement(local_e0,pXVar8);
          }
          local_fc = local_fc &
                     (FACET_MINEXCLUSIVE|FACET_MAXEXCLUSIVE|FACET_MAXINCLUSIVE|FACET_WHITESPACE|
                      FACET_PATTERN|FACET_MAXLENGTH|FACET_MINLENGTH|FACET_LENGTH);
          if ((FVar1 & FACET_PATTERN) != FACET_NONE) {
            local_fc = FACET_LENGTH;
          }
          pXVar5 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
          XSMultiValueFacet::XSMultiValueFacet
                    (pXVar5,FACET_PATTERN,(StringList *)local_e0,(bool)((undefined1)local_fc & 1),
                     pXVar6,xsModel,this->fMemoryManager);
          BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
                    (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,
                     (XSObject *)pXVar5);
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement(local_e8,pXVar5);
          fixedFacets = fixedFacets | FVar1 & FACET_PATTERN;
          definedFacets = definedFacets | FACET_PATTERN;
          XMLStringTokenizer::~XMLStringTokenizer(&tokenizer);
        }
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&e);
  }
  if ((definedFacets & FACET_WHITESPACE) == FACET_NONE) {
    pXVar7 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar8 = DatatypeValidator::getWSstring(dv,dv->fWhiteSpace);
    XSFacet::XSFacet(pXVar7,FACET_WHITESPACE,pXVar8,false,(XSAnnotation *)0x0,xsModel,
                     this->fMemoryManager);
    BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
              (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)pXVar7
              );
    BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_01,pXVar7);
    definedFacets = definedFacets | FACET_WHITESPACE;
  }
  iVar3 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
  if ((CONCAT44(extraout_var_00,iVar3) != 0) &&
     (iVar3 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST),
     *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x28) == 0x10)) {
    iVar3 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
    pBVar10 = *(BaseRefVectorOf<xercesc_4_0::XSFacet> **)(CONCAT44(extraout_var_02,iVar3) + 0x50);
    for (uVar4 = 0; (ulong)uVar4 < pBVar10->fCurCount; uVar4 = uVar4 + 1) {
      pXVar7 = BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt(pBVar10,(ulong)uVar4);
      if ((pXVar7->fFacetKind & definedFacets) == FACET_NONE) {
        definedFacets = pXVar7->fFacetKind | definedFacets;
        BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_01,pXVar7);
        if (pXVar7->fIsFixed == true) {
          fixedFacets = fixedFacets | pXVar7->fFacetKind;
        }
      }
    }
    if ((local_e8 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) &&
       (this_00 = *(BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> **)
                   (CONCAT44(extraout_var_02,iVar3) + 0x58),
       this_00 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0)) {
      for (uVar4 = 0; (ulong)uVar4 < this_00->fCurCount; uVar4 = uVar4 + 1) {
        pXVar5 = BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt(this_00,(ulong)uVar4);
        if ((pXVar5->fFacetKind & definedFacets) == FACET_NONE) {
          definedFacets = pXVar5->fFacetKind | definedFacets;
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement(local_e8,pXVar5);
          if (pXVar5->fIsFixed == true) {
            fixedFacets = fixedFacets | pXVar5->fFacetKind;
          }
        }
      }
    }
  }
  XSSimpleTypeDefinition::setFacetInfo
            (xsST,definedFacets,fixedFacets,(XSFacetList *)this_01,(XSMultiValueFacetList *)local_e8
             ,(StringList *)local_e0);
  return;
}

Assistant:

void XSObjectFactory::processFacets(DatatypeValidator* const dv,
                                    XSModel* const xsModel,
                                    XSSimpleTypeDefinition* const xsST)
{
    // NOTE: XSMultiValueFacetList is not owned by XSModel!
    // NOTE: XSFacetList is not owned by XSModel!
    bool isFixed = false;
    int dvFacetsDefined = dv->getFacetsDefined();
    int dvFixedFacets = dv->getFixed();
    int definedFacets = 0;
    int fixedFacets = 0;
    XSMultiValueFacetList* xsMultiFacetList = 0;
    StringList* patternList = 0;
    XSFacetList* xsFacetList = new (fMemoryManager) RefVectorOf<XSFacet>(4, false, fMemoryManager);

    if (isMultiValueFacetDefined(dv))
        xsMultiFacetList = new (fMemoryManager) RefVectorOf<XSMultiValueFacet>(2, false, fMemoryManager);

    if (dvFacetsDefined & DatatypeValidator::FACET_ENUMERATION)
    {
        RefArrayVectorOf<XMLCh>* enumList = (RefArrayVectorOf<XMLCh>*) dv->getEnumString();

        if (dvFixedFacets & DatatypeValidator::FACET_ENUMERATION)
        {
            isFixed = true;
            fixedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
        }

        XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
            XSSimpleTypeDefinition::FACET_ENUMERATION , enumList, isFixed
            , getAnnotationFromModel(xsModel, enumList), xsModel, fMemoryManager
        );

        fDeleteVector->addElement(mvFacet);
        xsMultiFacetList->addElement(mvFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
    }

    if (dv->getFacets())
    {
        RefHashTableOfEnumerator<KVStringPair> e(dv->getFacets(), false, fMemoryManager);
        while (e.hasMoreElements())
        {
            KVStringPair& pair = e.nextElement();
            XMLCh* key = pair.getKey();
            XSSimpleTypeDefinition::FACET facetType;
            XSAnnotation* annot = getAnnotationFromModel(xsModel, &pair);

            if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXINCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXINCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXEXCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MININCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MININCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINEXCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_LENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_LENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_LENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_TOTALDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_TOTALDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_FRACTIONDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_FRACTIONDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
            {
                facetType = XSSimpleTypeDefinition::FACET_WHITESPACE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_WHITESPACE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN) && xsMultiFacetList)
            {
                XMLStringTokenizer tokenizer(dv->getPattern(), regexSeparator, fMemoryManager);
                patternList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                    tokenizer.countTokens(), true, fMemoryManager
                );

                while (tokenizer.hasMoreTokens())
                    patternList->addElement(XMLString::replicate(tokenizer.nextToken(), fMemoryManager));

                if (dvFixedFacets & DatatypeValidator::FACET_PATTERN)
                {
                    isFixed = true;
                    fixedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                }

                XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
                    XSSimpleTypeDefinition::FACET_PATTERN, patternList
                    , isFixed, annot, xsModel, fMemoryManager
                );
                fDeleteVector->addElement(mvFacet);
                xsMultiFacetList->addElement(mvFacet);
                definedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                continue;
            }
            else
            {
                // REVISIT: hmm... what about XSSimpleTypeDefinition::FACET_NONE
                // don't think I need to create an empty Facet?
                continue;
            }

            XSFacet* xsFacet = new (fMemoryManager) XSFacet(
                facetType, pair.getValue(), isFixed, annot, xsModel, fMemoryManager);

            fDeleteVector->addElement(xsFacet);
            xsFacetList->addElement(xsFacet);
            definedFacets |= facetType;
            if (isFixed)
                fixedFacets |= facetType;
        }
    }

    // add whistespace facet if missing
    if ((definedFacets & XSSimpleTypeDefinition::FACET_WHITESPACE) == 0)
    {
        XSFacet* xsFacet = new (fMemoryManager) XSFacet(
            XSSimpleTypeDefinition::FACET_WHITESPACE
            , dv->getWSstring(dv->getWSFacet())
            , false, 0, xsModel, fMemoryManager);

        fDeleteVector->addElement(xsFacet);
        xsFacetList->addElement(xsFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_WHITESPACE;
    }

    // inherit facets from base

    if (xsST->getBaseType() && xsST->getBaseType()->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE)
    {
        XSSimpleTypeDefinition* baseST = (XSSimpleTypeDefinition*) xsST->getBaseType();
        XSFacetList* baseFacets = baseST->getFacets();

        for (unsigned int i=0; i<baseFacets->size(); i++)
        {
            XSFacet* bFacet = baseFacets->elementAt(i);
            if ((definedFacets & bFacet->getFacetKind()) == 0)
            {
                definedFacets |= bFacet->getFacetKind();
                xsFacetList->addElement(bFacet);
                if (bFacet->isFixed())
                    fixedFacets |= bFacet->getFacetKind();
            }
        }

        if (baseST->getMultiValueFacets() && xsMultiFacetList)
        {
            XSMultiValueFacetList* baseMVFacets = baseST->getMultiValueFacets();
            for (unsigned int j=0; j<baseMVFacets->size(); j++)
            {
                XSMultiValueFacet* bFacet = baseMVFacets->elementAt(j);
                if ((definedFacets & bFacet->getFacetKind()) == 0)
                {
                    definedFacets |= bFacet->getFacetKind();
                    xsMultiFacetList->addElement(bFacet);
                    if (bFacet->isFixed())
                        fixedFacets |= bFacet->getFacetKind();
                }
            }
        }
    }

    xsST->setFacetInfo(definedFacets, fixedFacets, xsFacetList, xsMultiFacetList, patternList);
}